

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_runtime_api.cc
# Opt level: O1

int TVMCFuncSetReturn(TVMRetValueHandle ret,TVMValue_conflict *value,int *type_code,int num_ret)

{
  ostream *poVar1;
  LogCheckError _check_err;
  LogCheckError local_1b0;
  int local_1a4;
  TVMValue_conflict local_1a0;
  int local_198;
  
  local_1a0.v_ctx.device_type = num_ret;
  local_1a4 = 1;
  dmlc::LogCheck_EQ<int,int>((dmlc *)&local_1b0,(int *)&local_1a0.v_int64,&local_1a4);
  if (local_1b0.str != (string *)0x0) {
    dmlc::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1a0.v_type,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/c_runtime_api.cc"
               ,0x1df);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.v_type,"Check failed: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.v_type,"num_ret == 1",0xc);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a0.v_type,((local_1b0.str)->_M_dataplus)._M_p,
                        (local_1b0.str)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
    dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0.v_type);
  }
  dmlc::LogCheckError::~LogCheckError(&local_1b0);
  local_1a0 = *value;
  local_198 = *type_code;
  tvm::runtime::TVMRetValue::Assign<tvm::runtime::TVMArgValue>
            ((TVMRetValue *)ret,(TVMArgValue *)&local_1a0.v_type);
  return 0;
}

Assistant:

int TVMCFuncSetReturn(TVMRetValueHandle ret,
                      TVMValue *value,
                      int *type_code,
                      int num_ret) {
  API_BEGIN();
  CHECK_EQ(num_ret, 1);
  TVMRetValue *rv = static_cast<TVMRetValue *>(ret);
  *rv = TVMArgValue(value[0], type_code[0]);
  API_END();
}